

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# savestream.cpp
# Opt level: O2

void __thiscall signalInfo_t::addMetaInfo(signalInfo_t *this,string *method,Value *params)

{
  ostream *poVar1;
  size_t in_RCX;
  undefined1 auStack_68 [80];
  
  poVar1 = std::ostream::_M_insert<long>((long)&this->metaInfoFile);
  poVar1 = std::operator<<(poVar1,": ");
  poVar1 = std::operator<<(poVar1,(string *)method);
  poVar1 = std::operator<<(poVar1," ");
  Json::FastWriter::FastWriter((FastWriter *)(auStack_68 + 0x20));
  Json::FastWriter::write_abi_cxx11_
            ((FastWriter *)auStack_68,(int)(FastWriter *)(auStack_68 + 0x20),params,in_RCX);
  poVar1 = std::operator<<(poVar1,(string *)auStack_68);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)auStack_68);
  Json::FastWriter::~FastWriter((FastWriter *)(auStack_68 + 0x20));
  return;
}

Assistant:

void addMetaInfo(const std::string& method, const Json::Value& params)
	{
		metaInfoFile << dataFileNextLine << ": " << method << " " << Json::FastWriter().write(params) << std::endl;
	}